

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

int __thiscall smf::Options::optionQ(Options *this,string *aString,int *argp)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  int *argp_local;
  string *aString_local;
  Options *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)aString);
  cVar1 = *pcVar3;
  cVar2 = getFlag(this);
  if (cVar1 == cVar2) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)aString);
    if (*pcVar3 == '\0') {
      *argp = *argp + 1;
      this_local._4_4_ = 0;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)aString);
      cVar1 = *pcVar3;
      cVar2 = getFlag(this);
      if (cVar1 == cVar2) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)aString);
        if (*pcVar3 == '\0') {
          *argp = *argp + 1;
          this_local._4_4_ = 0;
        }
        else {
          this_local._4_4_ = 1;
        }
      }
      else {
        this_local._4_4_ = 1;
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Options::optionQ(const std::string& aString, int& argp) {
   if (aString[0] == getFlag()) {
      if (aString[1] == '\0') {
         argp++;
         return 0;
      } else if (aString[1] == getFlag()) {
         if (aString[2] == '\0') {
            argp++;
            return 0;
         } else {
            return 1;
         }
      } else {
         return 1;
      }
   } else {
      return 0;
   }
}